

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::container_internal::slot_type<int,int>::swap<std::allocator<std::pair<int_const,int>>>
               (allocator<std::pair<const_int,_int>_> *alloc,slot_type<int,_int> *a,
               slot_type<int,_int> *b)

{
  slot_type<int,_int> *b_local;
  slot_type<int,_int> *a_local;
  allocator<std::pair<const_int,_int>_> *alloc_local;
  
  std::swap<int,int>((pair<int,_int> *)&a->value,(pair<int,_int> *)&b->value);
  return;
}

Assistant:

static void swap(Allocator* alloc, slot_type* a, slot_type* b) {
    if (kMutableKeys::value) {
      using std::swap;
      swap(a->mutable_value, b->mutable_value);
    } else {
      value_type tmp = std::move(a->value);
      absl::allocator_traits<Allocator>::destroy(*alloc, &a->value);
      absl::allocator_traits<Allocator>::construct(*alloc, &a->value,
                                                   std::move(b->value));
      absl::allocator_traits<Allocator>::destroy(*alloc, &b->value);
      absl::allocator_traits<Allocator>::construct(*alloc, &b->value,
                                                   std::move(tmp));
    }
  }